

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_translation(mat4 *__return_storage_ptr__,vec3 v)

{
  undefined4 local_14;
  undefined4 uStack_10;
  vec3 v_local;
  
  local_14 = v.x;
  uStack_10 = v.y;
  mat4_create(__return_storage_ptr__,1.0,0.0,0.0,local_14,0.0,1.0,0.0,uStack_10,0.0,0.0,1.0,v.z,0.0,
              0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_translation(vec3 v) {
    return mat4_create(
            1.0, 0.0, 0.0, v.x,
            0.0, 1.0, 0.0, v.y,
            0.0, 0.0, 1.0, v.z,
            0.0, 0.0, 0.0, 1.0);
}